

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bte.cpp
# Opt level: O0

void __thiscall merlin::bte::forward(bte *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  reference this_00;
  reference pvVar6;
  reference pvVar7;
  reference puVar8;
  pointer ppVar9;
  double __x;
  double __x_00;
  value vVar10;
  double dVar11;
  reference rVar12;
  char *local_520;
  factor local_4f8;
  factor local_498;
  factor local_438;
  factor local_3d8;
  reference local_378;
  size_type local_368;
  size_t v;
  _Self local_358;
  iterator mi;
  factor bel;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2e8;
  const_iterator ci;
  factor F;
  factor local_248;
  factor local_1e8;
  variable_set local_178;
  factor local_140;
  factor local_e0;
  reference local_80;
  value_type local_70;
  size_t ei;
  size_type local_60;
  findex b;
  findex a;
  variable VX;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_20;
  const_iterator x;
  double timestamp;
  bte *this_local;
  
  if ((this->m_debug & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Begin forward (top-down) pass ...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  this->m_logz = 0.0;
  x._M_current = (unsigned_long *)timeSystem();
  local_28._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->m_order);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_20,&local_28);
  while( true ) {
    local_30._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->m_order);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    if ((this->m_debug & 1U) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout," - Eliminating var ");
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_20);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*puVar8);
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_20);
      join_0x00000010_0x00000000_ =
           std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_var_types,*puVar8);
      bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&VX.m_states);
      if (bVar1) {
        local_520 = " (MAP)\n";
      }
      else {
        local_520 = " (SUM)\n";
      }
      std::operator<<(poVar2,local_520);
    }
    puVar8 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_20);
    _a = graphical_model::var(&this->super_graphical_model,*puVar8);
    puVar8 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_20);
    pvVar3 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::operator[](&this->m_clusters,*puVar8);
    puVar4 = my_set<unsigned_long>::operator[](pvVar3,0);
    b = *puVar4;
    pvVar3 = std::
             vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ::operator[](&this->m_out,b);
    sVar5 = my_set<unsigned_long>::size(pvVar3);
    if (sVar5 != 0) {
      pvVar3 = std::
               vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ::operator[](&this->m_out,b);
      ei = (size_t)my_set<unsigned_long>::begin(pvVar3);
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&ei);
      local_60 = *puVar8;
      this_00 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](&this->m_edge_indeces,b);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (this_00,local_60);
      local_70 = *pvVar6;
      puVar8 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_20);
      local_80 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_var_types,*puVar8);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_80);
      if (bVar1) {
        incoming(&local_248,this,b,local_70);
        variable_set::variable_set((variable_set *)&F.c_,(variable *)&a);
        factor::max(&local_1e8,&local_248,(variable_set *)&F.c_);
        pvVar7 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           (&this->m_forward,local_70);
        factor::operator=(pvVar7,&local_1e8);
        factor::~factor(&local_1e8);
        variable_set::~variable_set((variable_set *)&F.c_);
        factor::~factor(&local_248);
      }
      else {
        incoming(&local_140,this,b,local_70);
        variable_set::variable_set(&local_178,(variable *)&a);
        factor::sum(&local_e0,&local_140,&local_178);
        pvVar7 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           (&this->m_forward,local_70);
        factor::operator=(pvVar7,&local_e0);
        factor::~factor(&local_e0);
        variable_set::~variable_set(&local_178);
        factor::~factor(&local_140);
      }
      if ((this->m_debug & 1U) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"  forward msg (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,b);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_60);
        poVar2 = std::operator<<(poVar2,"): elim = ");
        sVar5 = variable::operator_cast_to_unsigned_long((variable *)&a);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar5);
        std::operator<<(poVar2," -> ");
        pvVar7 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           (&this->m_forward,local_70);
        poVar2 = merlin::operator<<((ostream *)&std::cout,pvVar7);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_20);
  }
  factor::factor((factor *)&ci,0.0);
  local_2e8._M_current = (unsigned_long *)my_set<unsigned_long>::begin(&this->m_roots);
  while( true ) {
    bel._88_8_ = my_set<unsigned_long>::end(&this->m_roots);
    bVar1 = __gnu_cxx::operator!=
                      (&local_2e8,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&bel.c_);
    if (!bVar1) {
      vVar10 = factor::max((factor *)&ci);
      this->m_logz = this->m_logz + vVar10;
      poVar2 = std::operator<<((ostream *)&std::cout,"[BTE] Finished forward pass in ");
      dVar11 = timeSystem();
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar11 - (double)x._M_current);
      poVar2 = std::operator<<(poVar2," seconds");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      factor::~factor((factor *)&ci);
      return;
    }
    puVar8 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_2e8);
    calc_belief((factor *)&mi,this,*puVar8);
    puVar8 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_2e8);
    local_358._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::find(&this->m_cluster2var,puVar8);
    v = (size_t)std::
                map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::end(&this->m_cluster2var);
    bVar1 = std::operator!=(&local_358,(_Self *)&v);
    if (!bVar1) break;
    ppVar9 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                       (&local_358);
    local_368 = ppVar9->second;
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_var_types,local_368);
    local_378 = rVar12;
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_378);
    if (bVar1) {
      vVar10 = factor::max((factor *)&mi);
      factor::factor(&local_4f8,vVar10);
      log((merlin *)&local_498,__x_00);
      factor::operator+=((factor *)&ci,&local_498);
      factor::~factor(&local_498);
      factor::~factor(&local_4f8);
    }
    else {
      vVar10 = factor::sum((factor *)&mi);
      factor::factor(&local_438,vVar10);
      log((merlin *)&local_3d8,__x);
      factor::operator+=((factor *)&ci,&local_3d8);
      factor::~factor(&local_3d8);
      factor::~factor(&local_438);
    }
    factor::~factor((factor *)&mi);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_2e8);
  }
  __assert_fail("mi != m_cluster2var.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/bte.cpp",
                0x2df,"void merlin::bte::forward()");
}

Assistant:

void bte::forward() {

	if (m_debug) {
		std::cout << "Begin forward (top-down) pass ..." << std::endl;
	}

	m_logz = 0; // reset the log parition function
	double timestamp = timeSystem();
	for (variable_order_t::const_iterator x = m_order.begin(); x != m_order.end(); ++x) {

		if (m_debug) {
			std::cout << " - Eliminating var " << *x
					<< (m_var_types[*x] ? " (MAP)\n" : " (SUM)\n");
		}

		// Generate forward messages
		variable VX = var(*x);
		findex a = m_clusters[*x][0]; // get source bucket of the variable
		if (m_out[a].size() > 0) {
			findex b = *(m_out[a].begin()); // destination bucket
			size_t ei = m_edge_indeces[a][b]; // edge index (for message)
			if (m_var_types[*x] == false) { // SUM variable
				m_forward[ei] = incoming(a, ei).sum(VX);
			} else { // MAP variable
				m_forward[ei] = incoming(a, ei).max(VX);
			}

			if (m_debug) {
				std::cout << "  forward msg (" << a << "," << b << "): elim = " << VX << " -> ";
				std::cout << m_forward[ei] << std::endl;
			}
		}
	} // done

	// Compute log partition function logZ or MAP/MMAP value
	factor F(0.0);
	for (flist::const_iterator ci = m_roots.begin();
			ci != m_roots.end(); ++ci) {

		factor bel = calc_belief(*ci);
		std::map<size_t, size_t>::iterator mi = m_cluster2var.find(*ci);
		assert(mi != m_cluster2var.end());
		size_t v = mi->second;
		if (m_var_types[v] == false) { // SUM variable
			F += log( bel.sum());
		} else { // MAP variable
			F += log( bel.max() );
		}
	}

	// Partition function or MAP/MMAP value
	m_logz += F.max();

	std::cout << "[BTE] Finished forward pass in " << (timeSystem() - timestamp)
			<< " seconds" << std::endl;
}